

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_plane.cpp
# Opt level: O3

visplane_t *
swrenderer::R_FindPlane
          (secplane_t *height,FTextureID picnum,int lightlevel,double Alpha,bool additive,
          FTransform *xxform,int sky,FSectorPortal *portal)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  bool bVar3;
  undefined8 uVar4;
  bool bVar5;
  visplane_t *pvVar6;
  ulong uVar7;
  ulong uVar8;
  DAngle *pDVar9;
  DAngle *pDVar10;
  FSectorPortal *pFVar11;
  double *pdVar12;
  uint hash;
  int iVar14;
  undefined1 auVar13 [16];
  int iVar15;
  undefined1 auVar16 [16];
  double dVar18;
  double dVar20;
  undefined1 auVar19 [16];
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  double dVar24;
  undefined1 auVar25 [16];
  double dVar26;
  double dVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  int iVar45;
  int iVar46;
  int iVar49;
  undefined1 auVar47 [16];
  int iVar50;
  undefined1 auVar48 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar53 [16];
  bool local_104;
  int local_100;
  double *local_f8;
  double *local_f0;
  double *local_e8;
  double dStack_b0;
  FTransform local_98;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  double local_48;
  double dStack_40;
  long lVar17;
  
  iVar46 = SUB84(Alpha + 103079215104.0,0);
  if (skyflatnum.texnum == picnum.texnum) {
    local_e8 = &local_98.yOffs;
    pdVar12 = &local_98.baseyOffs;
    local_f0 = &local_98.xScale;
    local_f8 = &local_98.yScale;
    pDVar10 = &local_98.Angle;
    pDVar9 = &local_98.baseAngle;
    dVar18 = 0.0;
    dVar20 = 0.0;
    local_98.xOffs = 0.0;
    local_98.yOffs = 0.0;
    local_98.baseyOffs = 0.0;
    local_98.xScale = 1.0;
    local_98.yScale = 1.0;
    local_98.Angle.Degrees = 0.0;
    local_98.baseAngle.Degrees = 0.0;
    dVar24 = -1.0 / (height->normal).Z;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = (height->normal).Z;
    if (portal == (FSectorPortal *)0x0) {
      portal = (FSectorPortal *)0x0;
    }
    else {
      xxform = &local_98;
      if ((portal->mFlags & 2) == 0) {
        local_100 = 0;
        hash = 0x80;
        bVar3 = true;
        local_104 = false;
        goto LAB_002e0d1a;
      }
    }
    xxform = &local_98;
    lightlevel = 0;
    local_104 = false;
  }
  else {
    local_e8 = &xxform->yOffs;
    pdVar12 = &xxform->baseyOffs;
    local_f0 = &xxform->xScale;
    local_f8 = &xxform->yScale;
    pDVar10 = &xxform->Angle;
    pDVar9 = &xxform->baseAngle;
    local_104 = additive;
    if ((portal != (FSectorPortal *)0x0) && ((portal->mFlags & 2) == 0)) {
      dVar18 = (height->normal).X;
      dVar20 = (height->normal).Y;
      auVar22 = *(undefined1 (*) [16])&(height->normal).Z;
      dVar24 = height->negiC;
      hash = 0x80;
      bVar3 = true;
      local_100 = lightlevel;
      goto LAB_002e0d1a;
    }
    dVar18 = (height->normal).X;
    dVar20 = (height->normal).Y;
    auVar22 = *(undefined1 (*) [16])&(height->normal).Z;
    portal = (FSectorPortal *)0x0;
    dVar24 = height->negiC;
    pFVar11 = (FSectorPortal *)(ulong)(fakeAlpha | 0x80000000);
    if ((fake3D & 3) == 0) {
      pFVar11 = portal;
    }
    sky = (int)pFVar11;
    iVar46 = 0x10000;
  }
  hash = SUB84(height->D + 103079215104.0,0) * 7 + picnum.texnum * 3 + lightlevel & 0x7f;
  bVar3 = false;
  local_100 = lightlevel;
LAB_002e0d1a:
  pvVar6 = (visplane_t *)(&visplanes)[hash];
  dVar21 = auVar22._0_8_;
  if (pvVar6 != (visplane_t *)0x0) {
    uVar28 = auVar22._8_4_;
    uVar29 = auVar22._12_4_;
    uVar30 = uVar28;
    uVar31 = uVar29;
    dVar26 = dVar20;
    dVar27 = dVar20;
    do {
      if (bVar3) {
        if ((((portal == pvVar6->portal) && (dVar18 == (pvVar6->height).normal.X)) &&
            (dVar26 == (pvVar6->height).normal.Y)) &&
           ((dVar21 == (pvVar6->height).normal.Z &&
            ((double)CONCAT44(uVar29,uVar28) == (pvVar6->height).D)))) {
          if (portal->mType == 0) {
            return pvVar6;
          }
          if (((pvVar6->extralight == stacked_extralight) &&
              (pvVar6->visibility == stacked_visibility)) &&
             (((pvVar6->viewpos).X == (double)stacked_viewpos._0_8_ &&
              (((pvVar6->viewpos).Y == (double)stacked_viewpos._8_8_ &&
               ((pvVar6->viewpos).Z == (double)stacked_viewpos._16_8_)))))) {
            if (portal->mType != 1) {
              return pvVar6;
            }
            if (((pvVar6->Alpha == iVar46) && (pvVar6->Additive == local_104)) &&
               (((iVar46 == 0 ||
                 (((((pvVar6->picnum).texnum == picnum.texnum && (local_100 == pvVar6->lightlevel))
                   && (basecolormap == pvVar6->colormap)) &&
                  (local_58 = uVar28, uStack_54 = uVar29, uStack_50 = uVar30, uStack_4c = uVar31,
                  local_48 = dVar26, dStack_40 = dVar27,
                  bVar5 = FTransform::operator==(xxform,&pvVar6->xform), uVar28 = local_58,
                  uVar29 = uStack_54, uVar30 = uStack_50, uVar31 = uStack_4c, dVar26 = local_48,
                  dVar27 = dStack_40, bVar5)))) && ((pvVar6->viewangle).Degrees == stacked_angle))))
            {
              return pvVar6;
            }
          }
        }
      }
      else if (((((((dVar18 == (pvVar6->height).normal.X) && (dVar26 == (pvVar6->height).normal.Y))
                  && (dVar21 == (pvVar6->height).normal.Z)) &&
                 ((((double)CONCAT44(uVar29,uVar28) == (pvVar6->height).D &&
                   ((pvVar6->picnum).texnum == picnum.texnum)) &&
                  ((local_100 == pvVar6->lightlevel &&
                   ((basecolormap == pvVar6->colormap && (xxform->xOffs == (pvVar6->xform).xOffs))))
                  )))) && (*pdVar12 + *local_e8 == (pvVar6->xform).baseyOffs + (pvVar6->xform).yOffs
                          )) &&
               ((((*local_f0 == (pvVar6->xform).xScale && (*local_f8 == (pvVar6->xform).yScale)) &&
                 (pDVar10->Degrees + pDVar9->Degrees ==
                  (pvVar6->xform).Angle.Degrees + (pvVar6->xform).baseAngle.Degrees)) &&
                (((sky == pvVar6->sky && (CurrentPortalUniq == pvVar6->CurrentPortalUniq)) &&
                 ((pvVar6->MirrorFlags == (uint)_MirrorFlags &&
                  ((CurrentSkybox == pvVar6->CurrentSkybox && (ViewPos.X == (pvVar6->viewpos).X)))))
                 ))))) && ((ViewPos.Y == (pvVar6->viewpos).Y && (ViewPos.Z == (pvVar6->viewpos).Z)))
              ) {
        return pvVar6;
      }
      pvVar6 = pvVar6->next;
    } while (pvVar6 != (visplane_s *)0x0);
  }
  pvVar6 = new_visplane(hash);
  (pvVar6->height).normal.X = dVar18;
  (pvVar6->height).normal.Y = dVar20;
  dStack_b0 = auVar22._8_8_;
  (pvVar6->height).normal.Z = dVar21;
  (pvVar6->height).D = dStack_b0;
  (pvVar6->height).negiC = dVar24;
  (pvVar6->picnum).texnum = picnum.texnum;
  pvVar6->lightlevel = local_100;
  dVar24 = xxform->yOffs;
  dVar18 = xxform->baseyOffs;
  dVar20 = xxform->xScale;
  (pvVar6->xform).xOffs = xxform->xOffs;
  (pvVar6->xform).yOffs = dVar24;
  (pvVar6->xform).baseyOffs = dVar18;
  (pvVar6->xform).xScale = dVar20;
  (pvVar6->xform).yScale = xxform->yScale;
  (pvVar6->xform).Angle.Degrees = pDVar10->Degrees;
  (pvVar6->xform).baseAngle.Degrees = pDVar9->Degrees;
  pvVar6->colormap = basecolormap;
  pvVar6->sky = sky;
  pvVar6->portal = portal;
  uVar7 = (ulong)(uint)viewwidth;
  pvVar6->left = viewwidth;
  pvVar6->right = 0;
  pvVar6->extralight = stacked_extralight;
  pvVar6->visibility = stacked_visibility;
  (pvVar6->viewpos).Z = (double)stacked_viewpos._16_8_;
  uVar4 = stacked_viewpos._8_8_;
  (pvVar6->viewpos).X = (double)stacked_viewpos._0_8_;
  (pvVar6->viewpos).Y = (double)uVar4;
  (pvVar6->viewangle).Degrees = stacked_angle;
  pvVar6->Alpha = iVar46;
  pvVar6->Additive = local_104;
  pvVar6->CurrentPortalUniq = CurrentPortalUniq;
  pvVar6->MirrorFlags = (uint)_MirrorFlags;
  pvVar6->CurrentSkybox = CurrentSkybox;
  auVar22 = _DAT_005d6240;
  if (uVar7 != 0) {
    lVar17 = uVar7 - 1;
    auVar13._8_4_ = (int)lVar17;
    auVar13._0_8_ = lVar17;
    auVar13._12_4_ = (int)((ulong)lVar17 >> 0x20);
    uVar8 = 0;
    auVar13 = auVar13 ^ _DAT_005d6240;
    auVar16 = _DAT_005d6f50;
    auVar19 = _DAT_005d6f60;
    auVar23 = _DAT_005d6f70;
    auVar25 = _DAT_005d6230;
    do {
      auVar32 = auVar25 ^ auVar22;
      iVar46 = auVar13._0_4_;
      iVar45 = -(uint)(iVar46 < auVar32._0_4_);
      iVar14 = auVar13._4_4_;
      auVar33._4_4_ = -(uint)(iVar14 < auVar32._4_4_);
      iVar50 = auVar13._8_4_;
      iVar49 = -(uint)(iVar50 < auVar32._8_4_);
      iVar15 = auVar13._12_4_;
      auVar33._12_4_ = -(uint)(iVar15 < auVar32._12_4_);
      auVar42._4_4_ = iVar45;
      auVar42._0_4_ = iVar45;
      auVar42._8_4_ = iVar49;
      auVar42._12_4_ = iVar49;
      auVar51 = pshuflw(in_XMM11,auVar42,0xe8);
      auVar35._4_4_ = -(uint)(auVar32._4_4_ == iVar14);
      auVar35._12_4_ = -(uint)(auVar32._12_4_ == iVar15);
      auVar35._0_4_ = auVar35._4_4_;
      auVar35._8_4_ = auVar35._12_4_;
      auVar53 = pshuflw(in_XMM12,auVar35,0xe8);
      auVar33._0_4_ = auVar33._4_4_;
      auVar33._8_4_ = auVar33._12_4_;
      auVar52 = pshuflw(auVar51,auVar33,0xe8);
      auVar32._8_4_ = 0xffffffff;
      auVar32._0_8_ = 0xffffffffffffffff;
      auVar32._12_4_ = 0xffffffff;
      auVar32 = (auVar52 | auVar53 & auVar51) ^ auVar32;
      auVar32 = packssdw(auVar32,auVar32);
      if ((auVar32 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(undefined2 *)(&pvVar6->field_0xda + uVar8) = 0x7fff;
      }
      auVar33 = auVar35 & auVar42 | auVar33;
      auVar32 = packssdw(auVar33,auVar33);
      auVar52._8_4_ = 0xffffffff;
      auVar52._0_8_ = 0xffffffffffffffff;
      auVar52._12_4_ = 0xffffffff;
      auVar32 = packssdw(auVar32 ^ auVar52,auVar32 ^ auVar52);
      if ((auVar32._0_4_ >> 0x10 & 1) != 0) {
        *(undefined2 *)(&pvVar6->field_0xdc + uVar8) = 0x7fff;
      }
      auVar32 = auVar23 ^ auVar22;
      iVar45 = -(uint)(iVar46 < auVar32._0_4_);
      auVar47._4_4_ = -(uint)(iVar14 < auVar32._4_4_);
      iVar49 = -(uint)(iVar50 < auVar32._8_4_);
      auVar47._12_4_ = -(uint)(iVar15 < auVar32._12_4_);
      auVar34._4_4_ = iVar45;
      auVar34._0_4_ = iVar45;
      auVar34._8_4_ = iVar49;
      auVar34._12_4_ = iVar49;
      auVar41._4_4_ = -(uint)(auVar32._4_4_ == iVar14);
      auVar41._12_4_ = -(uint)(auVar32._12_4_ == iVar15);
      auVar41._0_4_ = auVar41._4_4_;
      auVar41._8_4_ = auVar41._12_4_;
      auVar47._0_4_ = auVar47._4_4_;
      auVar47._8_4_ = auVar47._12_4_;
      auVar32 = auVar41 & auVar34 | auVar47;
      auVar32 = packssdw(auVar32,auVar32);
      auVar1._8_4_ = 0xffffffff;
      auVar1._0_8_ = 0xffffffffffffffff;
      auVar1._12_4_ = 0xffffffff;
      auVar32 = packssdw(auVar32 ^ auVar1,auVar32 ^ auVar1);
      if ((auVar32 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        *(undefined2 *)(&pvVar6->field_0xde + uVar8) = 0x7fff;
      }
      auVar35 = pshufhw(auVar34,auVar34,0x84);
      auVar42 = pshufhw(auVar41,auVar41,0x84);
      auVar33 = pshufhw(auVar35,auVar47,0x84);
      auVar36._8_4_ = 0xffffffff;
      auVar36._0_8_ = 0xffffffffffffffff;
      auVar36._12_4_ = 0xffffffff;
      auVar36 = (auVar33 | auVar42 & auVar35) ^ auVar36;
      auVar35 = packssdw(auVar36,auVar36);
      if ((auVar35 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *(undefined2 *)((long)&pvVar6[1].next + uVar8) = 0x7fff;
      }
      auVar35 = auVar19 ^ auVar22;
      iVar45 = -(uint)(iVar46 < auVar35._0_4_);
      auVar38._4_4_ = -(uint)(iVar14 < auVar35._4_4_);
      iVar49 = -(uint)(iVar50 < auVar35._8_4_);
      auVar38._12_4_ = -(uint)(iVar15 < auVar35._12_4_);
      auVar43._4_4_ = iVar45;
      auVar43._0_4_ = iVar45;
      auVar43._8_4_ = iVar49;
      auVar43._12_4_ = iVar49;
      auVar32 = pshuflw(auVar32,auVar43,0xe8);
      auVar37._4_4_ = -(uint)(auVar35._4_4_ == iVar14);
      auVar37._12_4_ = -(uint)(auVar35._12_4_ == iVar15);
      auVar37._0_4_ = auVar37._4_4_;
      auVar37._8_4_ = auVar37._12_4_;
      in_XMM12 = pshuflw(auVar53 & auVar51,auVar37,0xe8);
      in_XMM12 = in_XMM12 & auVar32;
      auVar38._0_4_ = auVar38._4_4_;
      auVar38._8_4_ = auVar38._12_4_;
      auVar32 = pshuflw(auVar32,auVar38,0xe8);
      auVar51._8_4_ = 0xffffffff;
      auVar51._0_8_ = 0xffffffffffffffff;
      auVar51._12_4_ = 0xffffffff;
      auVar51 = (auVar32 | in_XMM12) ^ auVar51;
      auVar32 = packssdw(auVar51,auVar51);
      if ((auVar32 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(undefined2 *)((long)&pvVar6[1].next + uVar8 + 2) = 0x7fff;
      }
      auVar38 = auVar37 & auVar43 | auVar38;
      auVar32 = packssdw(auVar38,auVar38);
      auVar53._8_4_ = 0xffffffff;
      auVar53._0_8_ = 0xffffffffffffffff;
      auVar53._12_4_ = 0xffffffff;
      auVar32 = packssdw(auVar32 ^ auVar53,auVar32 ^ auVar53);
      if ((auVar32 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        *(undefined2 *)((long)&pvVar6[1].next + uVar8 + 4) = 0x7fff;
      }
      auVar32 = auVar16 ^ auVar22;
      iVar46 = -(uint)(iVar46 < auVar32._0_4_);
      auVar48._4_4_ = -(uint)(iVar14 < auVar32._4_4_);
      iVar50 = -(uint)(iVar50 < auVar32._8_4_);
      auVar48._12_4_ = -(uint)(iVar15 < auVar32._12_4_);
      auVar39._4_4_ = iVar46;
      auVar39._0_4_ = iVar46;
      auVar39._8_4_ = iVar50;
      auVar39._12_4_ = iVar50;
      auVar44._4_4_ = -(uint)(auVar32._4_4_ == iVar14);
      auVar44._12_4_ = -(uint)(auVar32._12_4_ == iVar15);
      auVar44._0_4_ = auVar44._4_4_;
      auVar44._8_4_ = auVar44._12_4_;
      auVar48._0_4_ = auVar48._4_4_;
      auVar48._8_4_ = auVar48._12_4_;
      auVar32 = auVar44 & auVar39 | auVar48;
      auVar32 = packssdw(auVar32,auVar32);
      auVar2._8_4_ = 0xffffffff;
      auVar2._0_8_ = 0xffffffffffffffff;
      auVar2._12_4_ = 0xffffffff;
      in_XMM11 = packssdw(auVar32 ^ auVar2,auVar32 ^ auVar2);
      if ((in_XMM11 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        *(undefined2 *)((long)&pvVar6[1].next + uVar8 + 6) = 0x7fff;
      }
      auVar32 = pshufhw(auVar39,auVar39,0x84);
      auVar33 = pshufhw(auVar44,auVar44,0x84);
      auVar35 = pshufhw(auVar32,auVar48,0x84);
      auVar40._8_4_ = 0xffffffff;
      auVar40._0_8_ = 0xffffffffffffffff;
      auVar40._12_4_ = 0xffffffff;
      auVar40 = (auVar35 | auVar33 & auVar32) ^ auVar40;
      auVar32 = packssdw(auVar40,auVar40);
      if ((auVar32 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *(undefined2 *)((long)&pvVar6[1].colormap + uVar8) = 0x7fff;
      }
      lVar17 = auVar25._8_8_;
      auVar25._0_8_ = auVar25._0_8_ + 8;
      auVar25._8_8_ = lVar17 + 8;
      lVar17 = auVar23._8_8_;
      auVar23._0_8_ = auVar23._0_8_ + 8;
      auVar23._8_8_ = lVar17 + 8;
      lVar17 = auVar19._8_8_;
      auVar19._0_8_ = auVar19._0_8_ + 8;
      auVar19._8_8_ = lVar17 + 8;
      lVar17 = auVar16._8_8_;
      auVar16._0_8_ = auVar16._0_8_ + 8;
      auVar16._8_8_ = lVar17 + 8;
      uVar8 = uVar8 + 0x10;
    } while ((uVar7 * 2 + 0xe & 0xfffffffffffffff0) != uVar8);
  }
  return pvVar6;
}

Assistant:

visplane_t *R_FindPlane (const secplane_t &height, FTextureID picnum, int lightlevel, double Alpha, bool additive,
						const FTransform &xxform,
						 int sky, FSectorPortal *portal)
{
	secplane_t plane;
	visplane_t *check;
	unsigned hash;						// killough
	bool isskybox;
	const FTransform *xform = &xxform;
	fixed_t alpha = FLOAT2FIXED(Alpha);
	//angle_t angle = (xform.Angle + xform.baseAngle).BAMs();

	FTransform nulltransform;

	if (picnum == skyflatnum)	// killough 10/98
	{ // most skies map together
		lightlevel = 0;
		xform = &nulltransform;
		nulltransform.xOffs = nulltransform.yOffs = nulltransform.baseyOffs = 0;
		nulltransform.xScale = nulltransform.yScale = 1;
		nulltransform.Angle = nulltransform.baseAngle = 0.0;
		additive = false;
		// [RH] Map floor skies and ceiling skies to separate visplanes. This isn't
		// always necessary, but it is needed if a floor and ceiling sky are in the
		// same column but separated by a wall. If they both try to reside in the
		// same visplane, then only the floor sky will be drawn.
		plane.set(0., 0., height.fC(), 0.);
		isskybox = portal != NULL && !(portal->mFlags & PORTSF_INSKYBOX);
	}
	else if (portal != NULL && !(portal->mFlags & PORTSF_INSKYBOX))
	{
		plane = height;
		isskybox = true;
	}
	else
	{
		plane = height;
		isskybox = false;
		// kg3D - hack, store alpha in sky
		// i know there is ->alpha, but this also allows to identify fake plane
		// and ->alpha is for stacked sectors
		if (fake3D & (FAKE3D_FAKEFLOOR|FAKE3D_FAKECEILING)) sky = 0x80000000 | fakeAlpha;
		else sky = 0;	// not skyflatnum so it can't be a sky
		portal = NULL;
		alpha = OPAQUE;
	}

	// New visplane algorithm uses hash table -- killough
	hash = isskybox ? MAXVISPLANES : visplane_hash (picnum.GetIndex(), lightlevel, height);

	for (check = visplanes[hash]; check; check = check->next)	// killough
	{
		if (isskybox)
		{
			if (portal == check->portal && plane == check->height)
			{
				if (portal->mType != PORTS_SKYVIEWPOINT)
				{ // This skybox is really a stacked sector, so we need to
				  // check even more.
					if (check->extralight == stacked_extralight &&
						check->visibility == stacked_visibility &&
						check->viewpos == stacked_viewpos &&
						(
							// headache inducing logic... :(
							(portal->mType != PORTS_STACKEDSECTORTHING) ||
							(
								check->Alpha == alpha &&
								check->Additive == additive &&
								(alpha == 0 ||	// if alpha is > 0 everything needs to be checked
									(plane == check->height &&
									 picnum == check->picnum &&
									 lightlevel == check->lightlevel &&
									 basecolormap == check->colormap &&	// [RH] Add more checks
									 *xform == check->xform
									)
								) &&
								check->viewangle == stacked_angle
							)
						)
					   )
					{
						return check;
					}
				}
				else
				{
					return check;
				}
			}
		}
		else
		if (plane == check->height &&
			picnum == check->picnum &&
			lightlevel == check->lightlevel &&
			basecolormap == check->colormap &&	// [RH] Add more checks
			*xform == check->xform &&
			sky == check->sky &&
			CurrentPortalUniq == check->CurrentPortalUniq &&
			MirrorFlags == check->MirrorFlags &&
			CurrentSkybox == check->CurrentSkybox &&
			ViewPos == check->viewpos
			)
		{
		  return check;
		}
	}

	check = new_visplane (hash);		// killough

	check->height = plane;
	check->picnum = picnum;
	check->lightlevel = lightlevel;
	check->xform = *xform;
	check->colormap = basecolormap;		// [RH] Save colormap
	check->sky = sky;
	check->portal = portal;
	check->left = viewwidth;			// Was SCREENWIDTH -- killough 11/98
	check->right = 0;
	check->extralight = stacked_extralight;
	check->visibility = stacked_visibility;
	check->viewpos = stacked_viewpos;
	check->viewangle = stacked_angle;
	check->Alpha = alpha;
	check->Additive = additive;
	check->CurrentPortalUniq = CurrentPortalUniq;
	check->MirrorFlags = MirrorFlags;
	check->CurrentSkybox = CurrentSkybox;

	fillshort (check->top, viewwidth, 0x7fff);

	return check;
}